

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>,duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  ulong uVar1;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  AggregateBinaryInput local_e8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(a,count,&local_78);
  Vector::ToUnifiedFormat(b,count,&local_c0);
  local_e8.left_mask = &local_78.validity;
  local_e8.right_mask = &local_c0.validity;
  local_e8.input = aggr_input_data;
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 &&
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = 0;
      do {
        local_e8.lidx = uVar1;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          local_e8.lidx = (idx_t)(local_78.sel)->sel_vector[uVar1];
        }
        local_e8.ridx = uVar1;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          local_e8.ridx = (idx_t)(local_c0.sel)->sel_vector[uVar1];
        }
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  ((ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *)state,
                   (timestamp_t *)(local_78.data + local_e8.lidx * 8),
                   (string_t *)(local_c0.data + local_e8.ridx * 0x10),&local_e8);
        uVar1 = uVar1 + 1;
      } while (count != uVar1);
    }
  }
  else if (count != 0) {
    uVar1 = 0;
    do {
      local_e8.lidx = uVar1;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        local_e8.lidx = (idx_t)(local_78.sel)->sel_vector[uVar1];
      }
      local_e8.ridx = uVar1;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        local_e8.ridx = (idx_t)(local_c0.sel)->sel_vector[uVar1];
      }
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [local_e8.lidx >> 6] >> (local_e8.lidx & 0x3f) & 1) != 0)) &&
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [local_e8.ridx >> 6] >> (local_e8.ridx & 0x3f) & 1) != 0)))) {
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  ((ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *)state,
                   (timestamp_t *)(local_78.data + local_e8.lidx * 8),
                   (string_t *)(local_c0.data + local_e8.ridx * 0x10),&local_e8);
      }
      uVar1 = uVar1 + 1;
    } while (count != uVar1);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}